

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::SetTrackerData
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *address,void *data)

{
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  undefined4 *puVar4;
  void **ppvVar5;
  
  bVar2 = Recycler::DoProfileAllocTracker();
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x8da,"(Recycler::DoProfileAllocTracker())",
                       "Recycler::DoProfileAllocTracker()");
    if (!bVar2) goto LAB_0061df8a;
    *puVar4 = 0;
  }
  uVar3 = GetAddressIndex(this,address);
  if (uVar3 == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x8dc,"(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)",
                       "index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit");
    if (!bVar2) goto LAB_0061df8a;
    *puVar4 = 0;
  }
  ppvVar5 = GetTrackerDataArray(this);
  if (((((TrackerData *)data != &Recycler::TrackerData::ExplicitFreeListObjectData) &&
       ((TrackerData *)ppvVar5[uVar3] != &Recycler::TrackerData::ExplicitFreeListObjectData)) &&
      (data != (void *)0x0)) && ((TrackerData *)ppvVar5[uVar3] != (TrackerData *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x8e0,
                       "((existingTrackerData == nullptr || data == nullptr) || (existingTrackerData == &Recycler::TrackerData::ExplicitFreeListObjectData || data == &Recycler::TrackerData::ExplicitFreeListObjectData))"
                       ,
                       "(existingTrackerData == nullptr || data == nullptr) || (existingTrackerData == &Recycler::TrackerData::ExplicitFreeListObjectData || data == &Recycler::TrackerData::ExplicitFreeListObjectData)"
                      );
    if (!bVar2) {
LAB_0061df8a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  ppvVar5 = GetTrackerDataArray(this);
  ppvVar5[uVar3] = data;
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::SetTrackerData(void * address, void * data)
{
    Assert(Recycler::DoProfileAllocTracker());
    ushort index = this->GetAddressIndex(address);
    Assert(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);

    void* existingTrackerData = this->GetTrackerDataArray()[index];
    Assert((existingTrackerData == nullptr || data == nullptr) ||
        (existingTrackerData == &Recycler::TrackerData::ExplicitFreeListObjectData || data == &Recycler::TrackerData::ExplicitFreeListObjectData));
    this->GetTrackerDataArray()[index] = data;
}